

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_Brep::Transform(ON_Brep *this,ON_Xform *xform)

{
  ON_Object *this_00;
  ON_BrepFace *this_01;
  double t;
  ON_Curve *pOVar1;
  ON_BrepVertex *pOVar2;
  ON_BrepEdge *pOVar3;
  ON_BrepFace *pOVar4;
  ON_Mesh *pOVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ON_3fVector *pOVar7;
  double dVar8;
  bool bVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  ON_PlaneSurface *pOVar15;
  ON_NurbsSurface *nurbs_srf;
  double *pdVar16;
  ON_Surface *pOVar17;
  shared_ptr<const_ON_Mesh> *psVar18;
  long lVar19;
  long lVar20;
  ON_Xform *pOVar21;
  ON_BoundingBox *pOVar22;
  int i;
  long lVar23;
  ON_Mesh *pMesh;
  long lVar24;
  byte bVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar26;
  undefined4 uVar27;
  ON_3fVector OVar28;
  ON_Interval v;
  ON_Interval u;
  ON_3dPoint P;
  ON_3dPoint Q;
  double local_128;
  double local_118;
  ON_Interval local_f8;
  ON_Interval local_e8;
  undefined1 local_d8 [16];
  ON_BoundingBox local_c8;
  undefined8 local_90;
  undefined8 local_70;
  ON_3dPoint local_48;
  
  bVar25 = 0;
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x17])();
  iVar13 = ON_Xform::IsSimilarity(xform);
  dVar8 = ON_Xform::Determinant(xform,(double *)0x0);
  uVar26 = 0;
  uVar27 = 0x3ff00000;
  local_128 = 1.0;
  local_d8._8_4_ = extraout_XMM0_Dc;
  local_d8._0_8_ = dVar8;
  local_d8._12_4_ = extraout_XMM0_Dd;
  if (iVar13 != 0) {
    uVar26 = 0;
    uVar27 = 0;
    if (((dVar8 != 0.0) || (NAN(dVar8))) && (bVar9 = ON_IsValid(dVar8), bVar9)) {
      uVar26 = (undefined4)DAT_006a6010;
      uVar27 = DAT_006a6010._4_4_;
      dVar8 = (double)(local_d8._0_8_ & (ulong)DAT_006a6010);
      if (1e-06 < (double)((ulong)(dVar8 + -1.0) & (ulong)DAT_006a6010)) {
        uVar26 = 0x55555555;
        uVar27 = 0x3fd55555;
        local_128 = pow(dVar8,0.3333333333333333);
      }
    }
  }
  if (iVar13 != 1) {
    this->m_is_solid = 0;
  }
  ON_BoundingBox::Destroy(&this->m_bbox);
  lVar20 = (long)(this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
  bVar9 = true;
  if (0 < lVar20) {
    lVar24 = 0;
    do {
      pOVar1 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar24];
      if ((pOVar1 != (ON_Curve *)0x0) &&
         (iVar14 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])
                             (pOVar1,xform), (char)iVar14 == '\0')) {
        bVar9 = false;
      }
      lVar24 = lVar24 + 1;
    } while (lVar20 != lVar24);
  }
  lVar20 = (long)(this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
  if (0 < lVar20) {
    lVar24 = 0;
    do {
      pOVar17 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[lVar24];
      if (pOVar17 != (ON_Surface *)0x0) {
        if (((iVar13 == 0) &&
            (iVar14 = (*(pOVar17->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2b])
                                (pOVar17,0), iVar14 == 1)) &&
           ((pOVar17 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[lVar24],
            iVar14 = (*(pOVar17->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2b])
                               (pOVar17,1), iVar14 == 1 &&
            (pOVar15 = ON_PlaneSurface::Cast
                                 ((ON_Object *)
                                  (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[lVar24]),
            pOVar15 != (ON_PlaneSurface *)0x0)))) {
          nurbs_srf = ON_NurbsSurface::New();
          pOVar17 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[lVar24];
          iVar14 = (*(pOVar17->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3c])
                             (0,pOVar17,nurbs_srf);
          if (iVar14 == 0) {
            if (nurbs_srf != (ON_NurbsSurface *)0x0) goto LAB_003ecac4;
            goto LAB_003ecacd;
          }
          iVar14 = (*(nurbs_srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                     [0x1c])(nurbs_srf,xform);
          if ((char)iVar14 == '\0') {
LAB_003ecac4:
            (*(nurbs_srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])
                      (nurbs_srf);
            goto LAB_003ecacd;
          }
        }
        else {
LAB_003ecacd:
          nurbs_srf = (ON_NurbsSurface *)0x0;
        }
        iVar14 = (*((this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[lVar24]->super_ON_Geometry).
                   super_ON_Object._vptr_ON_Object[0x1c])();
        if ((char)iVar14 == '\0') {
          if (nurbs_srf == (ON_NurbsSurface *)0x0) {
            bVar9 = false;
          }
          else {
            ON_BrepTransformSwapSrfHelper(this,nurbs_srf,(int)lVar24);
          }
        }
        else if (nurbs_srf != (ON_NurbsSurface *)0x0) {
          iVar14 = 0;
          (*(nurbs_srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                    (nurbs_srf,0);
          local_e8.m_t[1] = (double)CONCAT44(uVar27,uVar26);
          (*(nurbs_srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                    (nurbs_srf,1);
          local_f8.m_t[1] = (double)CONCAT44(uVar27,uVar26);
          do {
            i = 0;
            while( true ) {
              pdVar16 = ON_Interval::operator[](&local_e8,iVar14);
              dVar8 = *pdVar16;
              pdVar16 = ON_Interval::operator[](&local_f8,i);
              ON_Surface::PointAt(&local_c8.m_min,&nurbs_srf->super_ON_Surface,dVar8,*pdVar16);
              pOVar17 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[lVar24];
              pdVar16 = ON_Interval::operator[](&local_e8,iVar14);
              dVar8 = *pdVar16;
              pdVar16 = ON_Interval::operator[](&local_f8,i);
              t = *pdVar16;
              uVar26 = SUB84(t,0);
              uVar27 = (undefined4)((ulong)t >> 0x20);
              ON_Surface::PointAt(&local_48,pOVar17,dVar8,t);
              dVar8 = ON_3dPoint::DistanceTo(&local_c8.m_min,&local_48);
              if (2.3283064365386963e-10 < dVar8) break;
              if ((i != 0) || (i = 1, nurbs_srf == (ON_NurbsSurface *)0x0)) goto LAB_003ecc3e;
            }
            ON_BrepTransformSwapSrfHelper(this,nurbs_srf,(int)lVar24);
            nurbs_srf = (ON_NurbsSurface *)0x0;
LAB_003ecc3e:
          } while ((iVar14 == 0) && (iVar14 = 1, nurbs_srf != (ON_NurbsSurface *)0x0));
          if (nurbs_srf != (ON_NurbsSurface *)0x0) {
            (*(nurbs_srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])
                      (nurbs_srf);
          }
        }
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar20);
  }
  lVar20 = (long)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
                 m_count;
  if (0 < lVar20) {
    lVar24 = 0;
    do {
      pOVar2 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
               m_a;
      cVar10 = (**(code **)(*(long *)((long)&(pOVar2->super_ON_Point).super_ON_Geometry.
                                             super_ON_Object._vptr_ON_Object + lVar24) + 0xe0))
                         ((long)&(pOVar2->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                 _vptr_ON_Object + lVar24,xform);
      if (cVar10 == '\0') {
        bVar9 = false;
      }
      lVar24 = lVar24 + 0x58;
    } while (lVar20 * 0x58 - lVar24 != 0);
  }
  lVar20 = (long)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                 m_count;
  if (0 < lVar20) {
    lVar24 = 0;
    do {
      pOVar3 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
      this_00 = (ON_Object *)
                ((long)&(((ON_CurveProxy *)(&(pOVar3->super_ON_CurveProxy).m_real_curve_domain + -2)
                         )->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object +
                lVar24);
      ON_Object::TransformUserData(this_00,xform);
      dVar8 = *(double *)((long)pOVar3->m_vi + lVar24 + 0x24);
      if (0.0 < dVar8 && (0.0 < local_128 && local_128 != 1.0)) {
        this_00[7].m_userdata_list = (ON_UserData *)(dVar8 * local_128);
      }
      lVar24 = lVar24 + 0x88;
    } while (lVar20 * 0x88 != lVar24);
  }
  lVar20 = (long)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                 m_count;
  if (0 < lVar20) {
    local_118 = ABS(local_d8._0_8_);
    lVar24 = 0;
    do {
      pOVar4 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
      this_01 = pOVar4 + lVar24;
      ON_Object::TransformUserData((ON_Object *)this_01,xform);
      pOVar22 = &pOVar4[lVar24].m_bbox;
      ON_BoundingBox::Destroy(pOVar22);
      ON_Geometry::BoundingBox(&local_c8,(ON_Geometry *)this_01);
      pOVar4[lVar24].m_bbox.m_max.y = local_c8.m_max.y;
      pOVar4[lVar24].m_bbox.m_max.z = local_c8.m_max.z;
      pOVar4[lVar24].m_bbox.m_min.z = local_c8.m_min.z;
      pOVar4[lVar24].m_bbox.m_max.x = local_c8.m_max.x;
      (pOVar22->m_min).x = local_c8.m_min.x;
      pOVar4[lVar24].m_bbox.m_min.y = local_c8.m_min.y;
      if (pOVar4[lVar24].m_face_index != -1) {
        ON_BoundingBox::Union(&this->m_bbox,pOVar22);
      }
      bVar12 = true;
      if (1.490116119385e-08 < local_118) {
        pdVar16 = ON_Xform::operator[](xform,3);
        if ((*pdVar16 == 0.0) && (!NAN(*pdVar16))) {
          pdVar16 = ON_Xform::operator[](xform,3);
          if ((pdVar16[1] == 0.0) && (!NAN(pdVar16[1]))) {
            pdVar16 = ON_Xform::operator[](xform,3);
            if ((pdVar16[2] == 0.0) && (!NAN(pdVar16[2]))) {
              pdVar16 = ON_Xform::operator[](xform,3);
              bVar12 = pdVar16[3] != 1.0;
            }
          }
        }
      }
      pOVar17 = ON_BrepFace::SurfaceOf(this_01);
      if (pOVar17 == (ON_Surface *)0x0) {
        bVar12 = false;
      }
      psVar18 = ON_BrepFace::UniqueMesh(this_01,render_mesh);
      pOVar5 = (psVar18->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var6 = (psVar18->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      if (pOVar5 != (ON_Mesh *)0x0) {
        if ((bVar12) && (bVar11 = ON_Mesh::EvaluateMeshGeometry(pOVar5,pOVar17), bVar11)) {
          if ((this_01->m_bRev == true) &&
             (lVar19 = (long)(pOVar5->m_N).super_ON_SimpleArray<ON_3fVector>.m_count, 0 < lVar19)) {
            lVar23 = 0;
            do {
              OVar28 = ON_3fVector::operator-
                                 ((ON_3fVector *)
                                  ((long)&((pOVar5->m_N).super_ON_SimpleArray<ON_3fVector>.m_a)->x +
                                  lVar23));
              pOVar7 = (pOVar5->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
              *(long *)((long)&pOVar7->x + lVar23) = OVar28._0_8_;
              *(float *)((long)&pOVar7->z + lVar23) = OVar28.z;
              lVar23 = lVar23 + 0xc;
            } while (lVar19 * 0xc != lVar23);
          }
        }
        else {
          (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(pOVar5,xform);
        }
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      psVar18 = ON_BrepFace::UniqueMesh(this_01,analysis_mesh);
      pOVar5 = (psVar18->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var6 = (psVar18->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      if (pOVar5 != (ON_Mesh *)0x0) {
        bVar11 = bVar12;
        if (!bVar12) {
          pOVar21 = xform;
          pOVar22 = &local_c8;
          for (lVar19 = 0x10; lVar19 != 0; lVar19 = lVar19 + -1) {
            (pOVar22->m_min).x = pOVar21->m_xform[0][0];
            pOVar21 = (ON_Xform *)((long)pOVar21 + ((ulong)bVar25 * -2 + 1) * 8);
            pOVar22 = (ON_BoundingBox *)((long)pOVar22 + ((ulong)bVar25 * -2 + 1) * 8);
          }
          local_c8.m_max.x = 0.0;
          local_90 = 0;
          local_70 = 0;
          iVar13 = ON_Xform::IsSimilarity((ON_Xform *)&local_c8);
          bVar11 = false;
          if (iVar13 != 1) {
            bVar11 = true;
          }
        }
        if (((pOVar17 == (ON_Surface *)0x0) || (!bVar11)) ||
           (bVar11 = ON_Mesh::EvaluateMeshGeometry(pOVar5,pOVar17), !bVar11)) {
          (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(pOVar5,xform);
        }
        else if ((this_01->m_bRev == true) &&
                (lVar19 = (long)(pOVar5->m_N).super_ON_SimpleArray<ON_3fVector>.m_count, 0 < lVar19)
                ) {
          lVar23 = 0;
          do {
            OVar28 = ON_3fVector::operator-
                               ((ON_3fVector *)
                                ((long)&((pOVar5->m_N).super_ON_SimpleArray<ON_3fVector>.m_a)->x +
                                lVar23));
            pOVar7 = (pOVar5->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
            *(long *)((long)&pOVar7->x + lVar23) = OVar28._0_8_;
            *(float *)((long)&pOVar7->z + lVar23) = OVar28.z;
            lVar23 = lVar23 + 0xc;
          } while (lVar19 * 0xc != lVar23);
        }
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      psVar18 = ON_BrepFace::UniqueMesh(this_01,preview_mesh);
      pOVar5 = (psVar18->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var6 = (psVar18->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      if (pOVar5 != (ON_Mesh *)0x0) {
        if ((bVar12) && (bVar12 = ON_Mesh::EvaluateMeshGeometry(pOVar5,pOVar17), bVar12)) {
          if ((this_01->m_bRev == true) &&
             (lVar19 = (long)(pOVar5->m_N).super_ON_SimpleArray<ON_3fVector>.m_count, 0 < lVar19)) {
            lVar23 = 0;
            do {
              OVar28 = ON_3fVector::operator-
                                 ((ON_3fVector *)
                                  ((long)&((pOVar5->m_N).super_ON_SimpleArray<ON_3fVector>.m_a)->x +
                                  lVar23));
              pOVar7 = (pOVar5->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
              *(long *)((long)&pOVar7->x + lVar23) = OVar28._0_8_;
              *(float *)((long)&pOVar7->z + lVar23) = OVar28.z;
              lVar23 = lVar23 + 0xc;
            } while (lVar19 * 0xc != lVar23);
          }
        }
        else {
          (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(pOVar5,xform);
        }
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar20);
  }
  ON_Object::TransformUserData((ON_Object *)this,xform);
  return bVar9;
}

Assistant:

bool ON_Brep::Transform( const ON_Xform& xform )
{
  int i, count;
  bool rc = true;
  
  DestroyRuntimeCache();

  int is_similarity = xform.IsSimilarity();
  const double det = xform.Determinant();
  bool bUniformScale = (0 != is_similarity && det != 0.0 && ON_IsValid(det) && fabs(fabs(det) - 1.0) > 1.0e-6);
  const double uniform_scale = bUniformScale ? pow(fabs(det), 1.0 / 3.0) : 1.0;

  if ( 1 != is_similarity )
  {
    // this will cause the solid flag to be
    // recaclulated the next time it is needed.
    m_is_solid = 0;
  }


  // 13 Feb 2003 Dale Lear:
  // Transforming the bbox makes it grow too large under repeated
  // rotations.  So, we will destroy it here and reset it below.
  //m_bbox.Transform(xform);
  m_bbox.Destroy();

  count = m_C3.Count();
  for ( i = 0; i < count; i++ ) 
  {
    if ( m_C3[i] ) 
    {
      if ( !m_C3[i]->Transform(xform) )
        rc = false;
    }
  }

  count = m_S.Count();
  for ( i = 0; i < count; i++ ) {
    if ( m_S[i] ) 
    
    {
      ON_NurbsSurface* nurbs_srf = 0;
      if ( !is_similarity )
      {
        if (    1 == m_S[i]->Degree(0) // degree tests reduce calls to
             && 1 == m_S[i]->Degree(1) // slow ON_PlaneSurface::Cast()
             && 0 != ON_PlaneSurface::Cast(m_S[i]) )
        {
          nurbs_srf = ON_NurbsSurface::New();
          if ( !m_S[i]->GetNurbForm(*nurbs_srf) )
          {
            delete nurbs_srf;
            nurbs_srf = 0;
          }
          else if ( !nurbs_srf->Transform(xform) )
          {
            delete nurbs_srf;
            nurbs_srf = 0;
          }
        }
      }

      if ( !m_S[i]->Transform(xform) )
      {
        if ( nurbs_srf )
        {
          ON_BrepTransformSwapSrfHelper(*this,nurbs_srf,i);
          nurbs_srf = 0;
        }
        else
        {
          rc = false;
        }
      }
      else if ( nurbs_srf )
      {
        // make sure transformation was good
        ON_Interval u = nurbs_srf->Domain(0);
        ON_Interval v = nurbs_srf->Domain(1);
        for ( int ui = 0; ui < 2 && nurbs_srf; ui++ ) for (int vi = 0; vi < 2 && nurbs_srf; vi++)
        {
          ON_3dPoint P = nurbs_srf->PointAt(u[ui],v[vi]);
          ON_3dPoint Q = m_S[i]->PointAt(u[ui],v[vi]);
          if ( P.DistanceTo(Q) > ON_ZERO_TOLERANCE )
          {
            ON_BrepTransformSwapSrfHelper(*this,nurbs_srf,i);
            nurbs_srf = 0;
            break;
          }
        }
        if ( nurbs_srf )
        {
          delete nurbs_srf;
          nurbs_srf = 0;
        }
      }
    }
  }

  count = m_V.Count();
  for ( i = 0; i < count; i++ ) {
    if ( !m_V[i].Transform(xform) )
      rc = false;
  }

  count = m_E.Count();
  for ( i = 0; i < count; i++ ) {
    ON_BrepEdge& edge = m_E[i];
    edge.TransformUserData(xform);
    // 2014-05-13 Dale Lear RH-26852
    //   Based on a conversation with Chuck, we will
    //   test scaling edge tolerances.  The bug
    //   bailed down to a unit system change from a 
    //   "long" unit to mm made a valid brep invalid
    //   because the edge tolerances were too small.
    //   This fix does ot handle non-uniform scaling.
    //   In the case of a non-uniform scale, the edge
    //   tolerance should be recalculated.
    if (edge.m_tolerance > 0.0 && uniform_scale > 0.0 && uniform_scale != 1.0)
    {
      edge.m_tolerance *= uniform_scale;
    }
  }

  count = m_F.Count();
  for ( i = 0; i < count; i++ ) 
  {
    ON_BrepFace& face = m_F[i];
    face.TransformUserData(xform);

    // 13 Feb 2003 Dale Lear:
    // Transforming the bbox makes it grow too large under repeated
    // rotations.  So, we need to reset it.
    face.m_bbox.Destroy();

    //GBA 20 May 2020. Brep box now computed from face boxes, instead of surface boxes.
    face.m_bbox = face.BoundingBox();    
    if ( face.m_face_index != -1 )
      m_bbox.Union( face.m_bbox );
    

    // 12 May 2003 Dale Lear - RR 10528
    //     Use surface evaluation to update rendermesh when 
    //     calling ON_Mesh::Transform() will map mesh normals
    //     to some thing different that the "true" surface
    //     normal.
    bool bEvMesh = ( fabs(det) <= ON_SQRT_EPSILON
                     || xform[3][0] != 0.0
                     || xform[3][1] != 0.0
                     || xform[3][2] != 0.0
                     || xform[3][3] != 1.0
                     );
    const ON_Surface* srf = face.SurfaceOf();

    if ( 0 == srf )
      bEvMesh = false;

    //Render meshes
    {
      auto spMesh = face.UniqueMesh(ON::render_mesh);
      if (spMesh)
      {
        auto pMesh = const_cast<ON_Mesh*>(spMesh.get());

        if ( bEvMesh && pMesh->EvaluateMeshGeometry(*srf) )
        {
          if ( face.m_bRev )
          {
            // 29 September 2003 Dale Lear
            //     Normals on render meshes (and face orientations)
            //     take face.m_bRev into account so that two sided
            //     materials work as expected.  EvaluateMeshGeometry()
            //     does not take face.m_bRev into account, so we need
            //     to reverse the face normals here.
            int ni, ncnt = pMesh->m_N.Count();
            for ( ni = 0; ni < ncnt; ni++ )
            {
              pMesh->m_N[ni] = -(pMesh->m_N[ni]);
            }
          }
        }
        else
        {
          pMesh->Transform(xform);
        }
      }
    }

    //Analysis meshes
    {
      auto spMesh = face.UniqueMesh(ON::analysis_mesh);
      if (spMesh)
      {
        auto pMesh = const_cast<ON_Mesh*>(spMesh.get());

        // Dale Lear 30 March 2009 - bug 46766
        //   Evaluate analysis meshes when the transform involves scaling
        //   so curvature values are properly updated.
        bool bEvAnalysisMesh = bEvMesh;
        if ( !bEvAnalysisMesh )
        {
          ON_Xform tmp(xform);
          tmp.m_xform[0][3] = 0.0;
          tmp.m_xform[1][3] = 0.0;
          tmp.m_xform[2][3] = 0.0;
          if ( 1 != tmp.IsSimilarity() )
            bEvAnalysisMesh = true;
        }
        // 1 Sept 2021, Mikko, RH-65468:
        // Added null check to prevent a crash.
        if ( bEvAnalysisMesh && nullptr != srf && pMesh->EvaluateMeshGeometry(*srf) )
        {
          // 28 Sept 2012, Mikko:
          // Apply the "29 September 2003 Dale Lear" fix above also to analysis meshes.
          if ( face.m_bRev )
          {
            int ni, ncnt = pMesh->m_N.Count();
            for ( ni = 0; ni < ncnt; ni++ )
            {
              pMesh->m_N[ni] = -(pMesh->m_N[ni]);
            }
          }
        }
        else
        {
          pMesh->Transform(xform);
        }
      }
    }

    //Preview meshes
    {
      auto spMesh = face.UniqueMesh(ON::preview_mesh);
      if (spMesh)
      {
        auto pMesh = const_cast<ON_Mesh*>(spMesh.get());
        if ( bEvMesh && pMesh->EvaluateMeshGeometry(*srf) )
        {
          if ( face.m_bRev )
          {
            // 10 June 2021, Mikko, RH-64582:
            // Fixed typo that caused a crash, changed "m_analysis_mesh" to "m_preview_mesh".
            int ni, ncnt = pMesh->m_N.Count();
            for ( ni = 0; ni < ncnt; ni++ )
            {
              pMesh->m_N[ni] = -(pMesh->m_N[ni]);
            }
          }
        }
        else
        {
          pMesh->Transform(xform);
        }
      }
    }
  }

  // The call to transform user data needs to be last
  // so that the rest of the brep is in position.
  // In particular, ON_BrepRegionTopologyUserData::Transform
  // assumes the face bounding boxes are up to date.
  TransformUserData(xform);

  return rc;
}